

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall
helics::FederateState::updateDataForTimeReturn
          (FederateState *this,MessageProcessingResult result,Time nextTime,IterationRequest iterate
          )

{
  pointer pIVar1;
  pointer puVar2;
  iterator iVar3;
  pointer puVar4;
  TimeCoordinator *pTVar5;
  Time TVar6;
  bool bVar7;
  InterfaceHandle *pIVar8;
  pointer puVar9;
  pointer puVar10;
  unique_lock<std::shared_mutex> uStack_40;
  
  this->mGrantCount = this->mGrantCount + 1;
  if (result == HALTED) {
    (this->time_granted).internalTimeCode = 0x7fffffffffffffff;
    (this->allowed_send_time).internalTimeCode = 0x7fffffffffffffff;
    this->iterating = false;
  }
  else {
    pTVar5 = (this->timeCoord)._M_t.
             super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
             .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
    (this->time_granted).internalTimeCode = (pTVar5->time_granted).internalTimeCode;
    (this->allowed_send_time).internalTimeCode =
         (pTVar5->info).outputDelay.internalTimeCode + (pTVar5->time_granted).internalTimeCode;
    this->iterating = result == ITERATING;
  }
  if (iterate == NO_ITERATIONS) {
    TVar6.internalTimeCode = (this->time_granted).internalTimeCode;
    if ((nextTime.internalTimeCode <= TVar6.internalTimeCode) &&
       (this->wait_for_current_time != true)) {
      fillEventVectorUpTo(this,TVar6);
      return;
    }
    pIVar1 = (this->events).
             super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->events).
        super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish != pIVar1) {
      (this->events).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pIVar1;
    }
    uStack_40._M_device = &(this->interfaceInformation).inputs.m_mutex;
    uStack_40._M_owns = false;
    std::unique_lock<std::shared_mutex>::lock(&uStack_40);
    uStack_40._M_owns = true;
    puVar9 = (this->interfaceInformation).inputs.m_obj.dataStorage.
             super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = *(pointer *)
              ((long)&(this->interfaceInformation).inputs.m_obj.dataStorage.
                      super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (puVar9 != puVar2) {
      do {
        bVar7 = InputInfo::updateTimeInclusive
                          ((puVar9->_M_t).
                           super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                           .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl,TVar6);
        if (bVar7) {
          pIVar8 = &(((puVar9->_M_t).
                      super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                      .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl)->id).handle;
          iVar3._M_current =
               (this->events).
               super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->events).
              super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>>::
            _M_realloc_insert<helics::InterfaceHandle_const&>
                      ((vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>> *)
                       &this->events,iVar3,pIVar8);
          }
          else {
            (iVar3._M_current)->hid = pIVar8->hid;
            (this->events).
            super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar2);
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&uStack_40);
    pIVar1 = (this->eventMessages).
             super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->eventMessages).
        super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish != pIVar1) {
      (this->eventMessages).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pIVar1;
    }
    uStack_40._M_device = &(this->interfaceInformation).endpoints.m_mutex;
    uStack_40._M_owns = false;
    std::unique_lock<std::shared_mutex>::lock(&uStack_40);
    uStack_40._M_owns = true;
    puVar10 = (this->interfaceInformation).endpoints.m_obj.dataStorage.
              super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = *(pointer *)
              ((long)&(this->interfaceInformation).endpoints.m_obj.dataStorage.
                      super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    if (puVar10 != puVar4) {
      do {
        bVar7 = EndpointInfo::updateTimeInclusive
                          ((puVar10->_M_t).
                           super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                           .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,TVar6)
        ;
        if (bVar7) {
          pIVar8 = &(((puVar10->_M_t).
                      super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                      .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).
                    handle;
          iVar3._M_current =
               (this->eventMessages).
               super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->eventMessages).
              super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>>::
            _M_realloc_insert<helics::InterfaceHandle_const&>
                      ((vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>> *)
                       &this->eventMessages,iVar3,pIVar8);
          }
          else {
            (iVar3._M_current)->hid = pIVar8->hid;
            (this->eventMessages).
            super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar4);
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&uStack_40);
    return;
  }
  if (iterate != ITERATE_IF_NEEDED) {
    if (iterate == FORCE_ITERATION) {
      fillEventVectorNextIteration(this,(Time)(this->time_granted).internalTimeCode);
      return;
    }
    return;
  }
  TVar6.internalTimeCode = (this->time_granted).internalTimeCode;
  if ((nextTime.internalTimeCode <= TVar6.internalTimeCode) && (this->wait_for_current_time != true)
     ) {
    fillEventVectorUpTo(this,TVar6);
    return;
  }
  pIVar1 = (this->events).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->events).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    (this->events).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar1;
  }
  uStack_40._M_device = &(this->interfaceInformation).inputs.m_mutex;
  uStack_40._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&uStack_40);
  uStack_40._M_owns = true;
  puVar9 = (this->interfaceInformation).inputs.m_obj.dataStorage.
           super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            ((long)&(this->interfaceInformation).inputs.m_obj.dataStorage.
                    super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (puVar9 != puVar2) {
    do {
      bVar7 = InputInfo::updateTimeNextIteration
                        ((puVar9->_M_t).
                         super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                         .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl,TVar6);
      if (bVar7) {
        pIVar8 = &(((puVar9->_M_t).
                    super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>
                    .super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl)->id).handle;
        iVar3._M_current =
             (this->events).
             super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->events).
            super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>>::
          _M_realloc_insert<helics::InterfaceHandle_const&>
                    ((vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>> *)
                     &this->events,iVar3,pIVar8);
        }
        else {
          (iVar3._M_current)->hid = pIVar8->hid;
          (this->events).
          super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar2);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&uStack_40);
  pIVar1 = (this->eventMessages).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->eventMessages).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar1) {
    (this->eventMessages).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar1;
  }
  uStack_40._M_device = &(this->interfaceInformation).endpoints.m_mutex;
  uStack_40._M_owns = false;
  std::unique_lock<std::shared_mutex>::lock(&uStack_40);
  uStack_40._M_owns = true;
  puVar10 = (this->interfaceInformation).endpoints.m_obj.dataStorage.
            super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = *(pointer *)
            ((long)&(this->interfaceInformation).endpoints.m_obj.dataStorage.
                    super__Vector_base<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>,_std::allocator<std::unique_ptr<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (puVar10 != puVar4) {
    do {
      bVar7 = EndpointInfo::updateTimeNextIteration
                        ((puVar10->_M_t).
                         super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                         .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl,TVar6);
      if (bVar7) {
        pIVar8 = &(((puVar10->_M_t).
                    super___uniq_ptr_impl<helics::EndpointInfo,_std::default_delete<helics::EndpointInfo>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_helics::EndpointInfo_*,_std::default_delete<helics::EndpointInfo>_>
                    .super__Head_base<0UL,_helics::EndpointInfo_*,_false>._M_head_impl)->id).handle;
        iVar3._M_current =
             (this->eventMessages).
             super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->eventMessages).
            super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>>::
          _M_realloc_insert<helics::InterfaceHandle_const&>
                    ((vector<helics::InterfaceHandle,std::allocator<helics::InterfaceHandle>> *)
                     &this->eventMessages,iVar3,pIVar8);
        }
        else {
          (iVar3._M_current)->hid = pIVar8->hid;
          (this->eventMessages).
          super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar4);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&uStack_40);
  return;
}

Assistant:

void FederateState::updateDataForTimeReturn(MessageProcessingResult result,
                                            Time nextTime,
                                            IterationRequest iterate)
{
    ++mGrantCount;
    if (result == MessageProcessingResult::HALTED) {
        time_granted = Time::maxVal();
        allowed_send_time = Time::maxVal();
        iterating = false;
    } else {
        time_granted = timeCoord->getGrantedTime();
        allowed_send_time = timeCoord->allowedSendTime();
        iterating = (result == MessageProcessingResult::ITERATING);
    }

    // now fill the event vector so external systems know what has been updated
    switch (iterate) {
        case IterationRequest::FORCE_ITERATION:
            fillEventVectorNextIteration(time_granted);
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
            if (time_granted < nextTime || wait_for_current_time) {
                fillEventVectorNextIteration(time_granted);
            } else {
                fillEventVectorUpTo(time_granted);
            }
            break;
        case IterationRequest::NO_ITERATIONS:
            if (time_granted < nextTime || wait_for_current_time) {
                fillEventVectorInclusive(time_granted);
            } else {
                fillEventVectorUpTo(time_granted);
            }
            break;
        default:
            break;
    }
}